

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O2

uint8 * __thiscall
caffe::ConvolutionParameter::InternalSerializeWithCachedSizesToArray
          (ConvolutionParameter *this,bool deterministic,uint8 *target)

{
  uint uVar1;
  uint8 *puVar2;
  UnknownFieldSet *unknown_fields;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 4) != 0) {
    target = google::protobuf::internal::WireFormatLite::WriteUInt32ToArray
                       (1,this->num_output_,target);
  }
  if ((uVar1 >> 0xc & 1) != 0) {
    target = google::protobuf::internal::WireFormatLite::WriteBoolToArray(2,this->bias_term_,target)
    ;
  }
  puVar2 = google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(3,&this->pad_,target);
  puVar2 = google::protobuf::internal::WireFormatLite::WriteUInt32ToArray
                     (4,&this->kernel_size_,puVar2);
  if ((uVar1 >> 0xd & 1) != 0) {
    puVar2 = google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(5,this->group_,puVar2);
  }
  puVar2 = google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(6,&this->stride_,puVar2);
  if ((uVar1 & 1) != 0) {
    puVar2 = google::protobuf::internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<caffe::FillerParameter>
                       (7,this->weight_filler_,deterministic,puVar2);
  }
  if ((uVar1 & 2) != 0) {
    puVar2 = google::protobuf::internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<caffe::FillerParameter>
                       (8,this->bias_filler_,deterministic,puVar2);
  }
  if ((uVar1 & 8) != 0) {
    puVar2 = google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(9,this->pad_h_,puVar2);
  }
  if ((uVar1 & 0x10) != 0) {
    puVar2 = google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(10,this->pad_w_,puVar2);
  }
  if ((uVar1 & 0x20) != 0) {
    puVar2 = google::protobuf::internal::WireFormatLite::WriteUInt32ToArray
                       (0xb,this->kernel_h_,puVar2);
  }
  if ((uVar1 & 0x40) != 0) {
    puVar2 = google::protobuf::internal::WireFormatLite::WriteUInt32ToArray
                       (0xc,this->kernel_w_,puVar2);
  }
  if ((char)uVar1 < '\0') {
    puVar2 = google::protobuf::internal::WireFormatLite::WriteUInt32ToArray
                       (0xd,this->stride_h_,puVar2);
  }
  if ((uVar1 >> 8 & 1) != 0) {
    puVar2 = google::protobuf::internal::WireFormatLite::WriteUInt32ToArray
                       (0xe,this->stride_w_,puVar2);
  }
  if ((uVar1 >> 9 & 1) != 0) {
    puVar2 = google::protobuf::internal::WireFormatLite::WriteEnumToArray(0xf,this->engine_,puVar2);
  }
  if ((uVar1 >> 0xb & 1) != 0) {
    puVar2 = google::protobuf::internal::WireFormatLite::WriteInt32ToArray(0x10,this->axis_,puVar2);
  }
  if ((uVar1 >> 10 & 1) != 0) {
    puVar2 = google::protobuf::internal::WireFormatLite::WriteBoolToArray
                       (0x11,this->force_nd_im2col_,puVar2);
  }
  puVar2 = google::protobuf::internal::WireFormatLite::WriteUInt32ToArray
                     (0x12,&this->dilation_,puVar2);
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) == 0) {
    return puVar2;
  }
  unknown_fields = ConvolutionParameter::unknown_fields(this);
  puVar2 = google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray
                     (unknown_fields,puVar2);
  return puVar2;
}

Assistant:

::google::protobuf::uint8* ConvolutionParameter::InternalSerializeWithCachedSizesToArray(
    bool deterministic, ::google::protobuf::uint8* target) const {
  // @@protoc_insertion_point(serialize_to_array_start:caffe.ConvolutionParameter)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional uint32 num_output = 1;
  if (cached_has_bits & 0x00000004u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(1, this->num_output(), target);
  }

  // optional bool bias_term = 2 [default = true];
  if (cached_has_bits & 0x00001000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(2, this->bias_term(), target);
  }

  // repeated uint32 pad = 3;
  target = ::google::protobuf::internal::WireFormatLite::
    WriteUInt32ToArray(3, this->pad_, target);

  // repeated uint32 kernel_size = 4;
  target = ::google::protobuf::internal::WireFormatLite::
    WriteUInt32ToArray(4, this->kernel_size_, target);

  // optional uint32 group = 5 [default = 1];
  if (cached_has_bits & 0x00002000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(5, this->group(), target);
  }

  // repeated uint32 stride = 6;
  target = ::google::protobuf::internal::WireFormatLite::
    WriteUInt32ToArray(6, this->stride_, target);

  // optional .caffe.FillerParameter weight_filler = 7;
  if (cached_has_bits & 0x00000001u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        7, *this->weight_filler_, deterministic, target);
  }

  // optional .caffe.FillerParameter bias_filler = 8;
  if (cached_has_bits & 0x00000002u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        8, *this->bias_filler_, deterministic, target);
  }

  // optional uint32 pad_h = 9 [default = 0];
  if (cached_has_bits & 0x00000008u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(9, this->pad_h(), target);
  }

  // optional uint32 pad_w = 10 [default = 0];
  if (cached_has_bits & 0x00000010u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(10, this->pad_w(), target);
  }

  // optional uint32 kernel_h = 11;
  if (cached_has_bits & 0x00000020u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(11, this->kernel_h(), target);
  }

  // optional uint32 kernel_w = 12;
  if (cached_has_bits & 0x00000040u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(12, this->kernel_w(), target);
  }

  // optional uint32 stride_h = 13;
  if (cached_has_bits & 0x00000080u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(13, this->stride_h(), target);
  }

  // optional uint32 stride_w = 14;
  if (cached_has_bits & 0x00000100u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(14, this->stride_w(), target);
  }

  // optional .caffe.ConvolutionParameter.Engine engine = 15 [default = DEFAULT];
  if (cached_has_bits & 0x00000200u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteEnumToArray(
      15, this->engine(), target);
  }

  // optional int32 axis = 16 [default = 1];
  if (cached_has_bits & 0x00000800u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteInt32ToArray(16, this->axis(), target);
  }

  // optional bool force_nd_im2col = 17 [default = false];
  if (cached_has_bits & 0x00000400u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(17, this->force_nd_im2col(), target);
  }

  // repeated uint32 dilation = 18;
  target = ::google::protobuf::internal::WireFormatLite::
    WriteUInt32ToArray(18, this->dilation_, target);

  if (_internal_metadata_.have_unknown_fields()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:caffe.ConvolutionParameter)
  return target;
}